

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_chr
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *this_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_20;
  value_type local_11;
  int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
  *local_10;
  int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
  *this_local;
  
  local_11 = (value_type)this->abs_value;
  local_10 = this;
  local_20 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator++(&this->out,0);
  this_00 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_20);
  std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(this_00,&local_11);
  return;
}

Assistant:

void on_chr() { *out++ = static_cast<Char>(abs_value); }